

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_clock.c
# Opt level: O2

void nni_msleep(nni_duration ms)

{
  int iVar1;
  undefined1 local_20 [8];
  timespec ts;
  
  local_20 = (undefined1  [8])(long)(ms / 1000);
  ts.tv_sec = (__time_t)((ms % 1000) * 1000000);
  do {
    if (ts.tv_sec == 0 && local_20 == (undefined1  [8])0x0) {
      return;
    }
    iVar1 = nanosleep((timespec *)local_20,(timespec *)local_20);
  } while (iVar1 != 0);
  return;
}

Assistant:

void
nni_msleep(nni_duration ms)
{
	struct timespec ts;

	ts.tv_sec  = ms / 1000;
	ts.tv_nsec = (ms % 1000) * 1000000;

	// Do this in a loop, so that interrupts don't actually wake
	// us.
	while (ts.tv_sec || ts.tv_nsec) {
		if (nanosleep(&ts, &ts) == 0) {
			break;
		}
	}
}